

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
          (FactoredDecPOMDPDiscrete *this,string *name,string *descr,string *pf)

{
  undefined1 *this_00;
  
  this_00 = &this->field_0x708;
  *(undefined ***)&this->field_0x708 = &PTR__POSGInterface_00618dd0;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_00,&PTR_PTR_00617580);
  *(undefined8 *)&this->field_0x710 = 0x618fb8;
  *(undefined8 *)&this->field_0x708 = 0x619168;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)this_00,&PTR_construction_vtable_232__00617558);
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface::
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface
            ((MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)&this->field_0x710,
             &PTR_construction_vtable_544__006175b8);
  *(undefined8 *)&this->field_0x708 = 0;
  FactoredDecPOMDPDiscreteInterface::FactoredDecPOMDPDiscreteInterface
            ((FactoredDecPOMDPDiscreteInterface *)this_00,&PTR_construction_vtable_352__00617520);
  MultiAgentDecisionProcessDiscreteFactoredStates::MultiAgentDecisionProcessDiscreteFactoredStates
            (&this->super_MultiAgentDecisionProcessDiscreteFactoredStates,
             &PTR_construction_vtable_80__00617490,name,descr,pf);
  DecPOMDP::DecPOMDP((DecPOMDP *)
                     &(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).field_0x600,
                     &PTR_construction_vtable_176__006174c0);
  *(undefined8 *)
   &(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).super_MultiAgentDecisionProcess =
       0x616940;
  *(undefined8 *)&this->field_0x708 = 0x616f08;
  *(undefined8 *)&this->field_0x710 = 0x617270;
  *(undefined8 *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).field_0x600 =
       0x616d08;
  (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  FactoredQFunctionScopeForStage::FactoredQFunctionScopeForStage(&this->_m_immRewScope);
  *(undefined8 *)
   ((long)&(this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrSFVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrSFVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrSFVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActionVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActionVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActionVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)((long)&this->_m_p_rModel + 2) = 0;
  (this->_m_nrXIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrXIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrXIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrSFVals).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrSFVals).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete(string name, string descr, string pf) :
    FactoredDecPOMDPDiscreteInterface()
    ,MultiAgentDecisionProcessDiscreteFactoredStates(name, descr, pf)   
    ,_m_p_rModel()
    ,_m_cached_FlatRM(false)
    ,_m_sparse_FlatRM(false)
{
 }